

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O0

type_of_iterator * __thiscall
roaring::Roaring64MapSetBitBiDirectionalIterator::operator--
          (Roaring64MapSetBitBiDirectionalIterator *this)

{
  bool bVar1;
  type_of_iterator *in_RDI;
  roaring_uint32_iterator_t *in_stack_ffffffffffffffb8;
  roaring_bitmap_t *in_stack_ffffffffffffffc0;
  const_iterator *pcVar2;
  _Self local_20;
  _Self local_18 [3];
  
  pcVar2 = &in_RDI->map_iter;
  local_18[0]._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
       ::cend((map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)in_stack_ffffffffffffffb8);
  bVar1 = std::operator==(pcVar2,local_18);
  if (bVar1) {
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator--
              ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
               in_stack_ffffffffffffffc0);
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)0x124f5d
              );
    roaring_iterator_init_last(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    if (((in_RDI->i).has_value & 1U) != 0) {
      return in_RDI;
    }
  }
  roaring_uint32_iterator_previous(in_stack_ffffffffffffffb8);
  while( true ) {
    if ((((in_RDI->i).has_value ^ 0xffU) & 1) == 0) {
      return in_RDI;
    }
    pcVar2 = &in_RDI->map_iter;
    local_20._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
         ::cbegin((map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                   *)in_stack_ffffffffffffffb8);
    bVar1 = std::operator==(pcVar2,&local_20);
    if (bVar1) break;
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator--
              ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)in_RDI,
               (int)((ulong)pcVar2 >> 0x20));
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)0x12500e
              );
    roaring_iterator_init_last((roaring_bitmap_t *)pcVar2,in_stack_ffffffffffffffb8);
  }
  return in_RDI;
}

Assistant:

type_of_iterator &operator--() {  //  --i, must return dec.value
        if (map_iter == p->cend()) {
            --map_iter;
            roaring_iterator_init_last(&map_iter->second.roaring, &i);
            if (i.has_value) return *this;
        }

        roaring_uint32_iterator_previous(&i);
        while (!i.has_value) {
            if (map_iter == p->cbegin()) return *this;
            map_iter--;
            roaring_iterator_init_last(&map_iter->second.roaring, &i);
        }
        return *this;
    }